

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc4.cc
# Opt level: O2

void RC4_set_key(RC4_KEY *key,int len,uchar *data)

{
  uint uVar1;
  uint i;
  long lVar2;
  uint i_1;
  uint uVar3;
  ulong uVar4;
  
  key->x = 0;
  key->y = 0;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    key->data[lVar2] = (uint)lVar2;
  }
  uVar3 = 0;
  uVar4 = 0;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    uVar1 = key->data[lVar2];
    uVar4 = (ulong)(byte)((char)uVar4 + (char)uVar1 + data[uVar3]);
    uVar3 = uVar3 + 1;
    if (uVar3 == len) {
      uVar3 = 0;
    }
    key->data[lVar2] = key->data[uVar4];
    key->data[uVar4] = uVar1;
  }
  return;
}

Assistant:

void RC4_set_key(RC4_KEY *rc4key, unsigned len, const uint8_t *key) {
  uint32_t *d = &rc4key->data[0];
  rc4key->x = 0;
  rc4key->y = 0;

  for (unsigned i = 0; i < 256; i++) {
    d[i] = i;
  }

  unsigned id1 = 0, id2 = 0;
  for (unsigned i = 0; i < 256; i++) {
    uint32_t tmp = d[i];
    id2 = (key[id1] + tmp + id2) & 0xff;
    if (++id1 == len) {
      id1 = 0;
    }
    d[i] = d[id2];
    d[id2] = tmp;
  }
}